

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::reserve(Tree *this,size_t cap)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  NodeData *pNVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  size_t first;
  byte bVar14;
  char msg [33];
  char local_138 [32];
  uint local_118;
  undefined4 uStack_f0;
  undefined3 uStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  char *pcStack_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  char *pcStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  bVar14 = 0;
  if (this->m_cap < cap) {
    pNVar8 = (NodeData *)
             (*(this->m_callbacks).m_allocate)
                       (cap * 0x90,this->m_buf,(this->m_callbacks).m_user_data);
    if (this->m_buf != (NodeData *)0x0) {
      memcpy(pNVar8,this->m_buf,this->m_cap * 0x90);
      (*(this->m_callbacks).m_free)(this->m_buf,this->m_cap * 0x90,(this->m_callbacks).m_user_data);
    }
    first = this->m_cap;
    this->m_cap = cap;
    this->m_buf = pNVar8;
    _clear_range(this,first,cap - first);
    if (this->m_free_head == 0xffffffffffffffff) {
      if (this->m_free_tail != 0xffffffffffffffff) {
        builtin_strncpy(local_138 + 0x10,"_free_tail == NO",0x10);
        builtin_strncpy(local_138,"check failed: (m",0x10);
        local_118 = 0x29454e;
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        local_98 = 0;
        uStack_90 = 0x6340;
        local_88 = 0;
        pcStack_80 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_78 = 0x65;
        LVar4.super_LineCol.col = 0;
        LVar4.super_LineCol.offset = SUB168(ZEXT816(0x6340) << 0x40,0);
        LVar4.super_LineCol.line = SUB168(ZEXT816(0x6340) << 0x40,8);
        LVar4.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar4.name.len = 0x65;
        (*(this->m_callbacks).m_error)(local_138,0x24,LVar4,(this->m_callbacks).m_user_data);
      }
      this->m_free_head = first;
      this->m_free_tail = cap - 1;
    }
    else {
      if (this->m_buf == (NodeData *)0x0) {
        builtin_strncpy(local_138 + 0x10,"_buf != nullptr)",0x10);
        builtin_strncpy(local_138,"check failed: (m",0x10);
        local_118 = local_118 & 0xffffff00;
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        local_48 = 0;
        uStack_40 = 0x6338;
        local_38 = 0;
        pcStack_30 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_28 = 0x65;
        LVar2.super_LineCol.col = 0;
        LVar2.super_LineCol.offset = SUB168(ZEXT816(0x6338) << 0x40,0);
        LVar2.super_LineCol.line = SUB168(ZEXT816(0x6338) << 0x40,8);
        LVar2.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar2.name.len = 0x65;
        (*(this->m_callbacks).m_error)(local_138,0x21,LVar2,(this->m_callbacks).m_user_data);
      }
      sVar9 = this->m_free_tail;
      if (sVar9 == 0xffffffffffffffff) {
        builtin_strncpy(local_138 + 0x10,"_free_tail != NO",0x10);
        builtin_strncpy(local_138,"check failed: (m",0x10);
        local_118 = 0x29454e;
        if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        local_70 = 0;
        uStack_68 = 0x6339;
        local_60 = 0;
        pcStack_58 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_50 = 0x65;
        LVar3.super_LineCol.col = 0;
        LVar3.super_LineCol.offset = SUB168(ZEXT816(0x6339) << 0x40,0);
        LVar3.super_LineCol.line = SUB168(ZEXT816(0x6339) << 0x40,8);
        LVar3.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar3.name.len = 0x65;
        (*(this->m_callbacks).m_error)(local_138,0x24,LVar3,(this->m_callbacks).m_user_data);
        sVar9 = this->m_free_tail;
      }
      pNVar8 = this->m_buf;
      pNVar8[sVar9].m_next_sibling = first;
      pNVar8[first].m_prev_sibling = sVar9;
      this->m_free_tail = cap - 1;
      first = this->m_free_head;
    }
    uVar10 = cap - 1;
    if (cap <= first && first != 0xffffffffffffffff) {
      pcVar12 = "check failed: (m_free_head == NONE || (m_free_head >= 0 && m_free_head < cap))";
      pcVar13 = local_138;
      for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(undefined8 *)pcVar13 = *(undefined8 *)pcVar12;
        pcVar12 = pcVar12 + ((ulong)bVar14 * -2 + 1) * 8;
        pcVar13 = pcVar13 + ((ulong)bVar14 * -2 + 1) * 8;
      }
      uStack_ec = 0x2929;
      uStack_f0 = 0x70616320;
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      local_c0 = 0;
      uStack_b8 = 0x6344;
      local_b0 = 0;
      pcStack_a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_a0 = 0x65;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6344) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x6344) << 0x40,8);
      LVar5.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar5.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_138,0x4f,LVar5,(this->m_callbacks).m_user_data);
      uVar10 = this->m_free_tail;
    }
    if (cap <= uVar10 && uVar10 != 0xffffffffffffffff) {
      pcVar12 = "check failed: (m_free_tail == NONE || (m_free_tail >= 0 && m_free_tail < cap))";
      pcVar13 = local_138;
      for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(undefined8 *)pcVar13 = *(undefined8 *)pcVar12;
        pcVar12 = pcVar12 + ((ulong)bVar14 * -2 + 1) * 8;
        pcVar13 = pcVar13 + ((ulong)bVar14 * -2 + 1) * 8;
      }
      uStack_ec = 0x2929;
      uStack_f0 = 0x70616320;
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      local_e8 = 0;
      uStack_e0 = 0x6345;
      local_d8 = 0;
      pcStack_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c8 = 0x65;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6345) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x6345) << 0x40,8);
      LVar6.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar6.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_138,0x4f,LVar6,(this->m_callbacks).m_user_data);
    }
    if (this->m_size == 0) {
      _claim_root(this);
    }
  }
  return;
}

Assistant:

void Tree::reserve(size_t cap)
{
    if(cap > m_cap)
    {
        NodeData *buf = _RYML_CB_ALLOC_HINT(m_callbacks, NodeData, cap, m_buf);
        if(m_buf)
        {
            memcpy(buf, m_buf, m_cap * sizeof(NodeData));
            _RYML_CB_FREE(m_callbacks, m_buf, NodeData, m_cap);
        }
        size_t first = m_cap, del = cap - m_cap;
        m_cap = cap;
        m_buf = buf;
        _clear_range(first, del);
        if(m_free_head != NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, m_buf != nullptr);
            _RYML_CB_ASSERT(m_callbacks, m_free_tail != NONE);
            m_buf[m_free_tail].m_next_sibling = first;
            m_buf[first].m_prev_sibling = m_free_tail;
            m_free_tail = cap-1;
        }
        else
        {
            _RYML_CB_ASSERT(m_callbacks, m_free_tail == NONE);
            m_free_head = first;
            m_free_tail = cap-1;
        }
        _RYML_CB_ASSERT(m_callbacks, m_free_head == NONE || (m_free_head >= 0 && m_free_head < cap));
        _RYML_CB_ASSERT(m_callbacks, m_free_tail == NONE || (m_free_tail >= 0 && m_free_tail < cap));

        if( ! m_size)
            _claim_root();
    }
}